

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::InvalidateDefaultSubFramebufferBindCase::render
          (InvalidateDefaultSubFramebufferBindCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  InvalidateDefaultSubFramebufferBindCase *pIVar1;
  deUint32 program;
  int iVar2;
  int iVar3;
  int height;
  DataTypes *samplerTypes;
  Context *pCVar4;
  deUint32 tex;
  deUint32 fbo;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  deUint32 local_4c8;
  deUint32 local_4c4;
  InvalidateDefaultSubFramebufferBindCase *local_4c0;
  Vector<float,_4> local_4b8;
  Surface *local_4a8;
  Vector<float,_4> local_4a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  GradientShader gradShader;
  FlatColorShader flatShader;
  Texture2DShader texShader;
  
  fbo = 0;
  tex = 0;
  local_4c0 = this;
  local_4a8 = dst;
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  gradShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  gradShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gradShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  samplerTypes = FboTestUtil::DataTypes::operator<<((DataTypes *)&gradShader,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&attachments,1.0);
  tcu::Vector<float,_4>::Vector(&local_4b8,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,samplerTypes,TYPE_FLOAT_VEC4,(Vec4 *)&attachments,&local_4b8);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&gradShader);
  FboTestUtil::GradientShader::GradientShader(&gradShader,TYPE_FLOAT_VEC4);
  pIVar1 = local_4c0;
  getDefaultFBDiscardAttachments(&attachments,local_4c0->m_buffers);
  this_00 = &(pIVar1->super_FboTestCase).super_ContextWrapper;
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4c4 = (*pCVar4->_vptr_Context[0x75])(pCVar4,&flatShader);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar4->_vptr_Context[0x75])(pCVar4,&texShader);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4c8 = (*pCVar4->_vptr_Context[0x75])(pCVar4,&gradShader);
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  local_4cc = sglr::ContextWrapper::getHeight(this_00);
  local_4cc = local_4cc / 4;
  local_4d0 = sglr::ContextWrapper::getWidth(this_00);
  local_4d0 = local_4d0 / 2;
  local_4d4 = sglr::ContextWrapper::getHeight(this_00);
  local_4d4 = local_4d4 / 2;
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = 1.0;
  local_4b8.m_data[1] = 0.0;
  local_4b8.m_data[2] = 0.0;
  local_4b8.m_data[3] = 1.0;
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar4,local_4c4,&local_4b8);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar4,program);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  tcu::Vector<float,_4>::Vector(&local_4b8,0.0);
  tcu::Vector<float,_4>::Vector(&local_4a0,1.0);
  FboTestUtil::GradientShader::setGradient(&gradShader,pCVar4,local_4c8,&local_4b8,&local_4a0);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  height = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,0x8058,iVar3,height,0,0x1908,0x1401,(void *)0x0);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,tex,0);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,0);
  FboTestCase::checkFramebufferStatus(&local_4c0->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = -1.0;
  local_4b8.m_data[1] = -1.0;
  local_4b8.m_data[2] = -1.0;
  local_4a0.m_data[0] = 1.0;
  local_4a0.m_data[1] = 1.0;
  local_4a0.m_data[2] = 1.0;
  sglr::drawQuad(pCVar4,local_4c4,(Vec3 *)&local_4b8,(Vec3 *)&local_4a0);
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)attachments.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),
             attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,iVar2 / 4,local_4cc,local_4d0,local_4d4);
  sglr::ContextWrapper::glDisable(this_00,0xb71);
  sglr::ContextWrapper::glDisable(this_00,0xb90);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = -1.0;
  local_4b8.m_data[1] = -1.0;
  local_4b8.m_data[2] = 0.0;
  local_4a0.m_data[0] = 1.0;
  local_4a0.m_data[1] = 1.0;
  local_4a0.m_data[2] = 0.0;
  sglr::drawQuad(pCVar4,local_4c8,(Vec3 *)&local_4b8,(Vec3 *)&local_4a0);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
  sglr::ContextWrapper::glClearColor(this_00,0.0,1.0,0.0,1.0);
  sglr::ContextWrapper::glClearStencil(this_00,1);
  sglr::ContextWrapper::glScissor(this_00,iVar2 / 4,local_4cc,local_4d0,local_4d4);
  sglr::ContextWrapper::glEnable(this_00,0xc11);
  sglr::ContextWrapper::glClear(this_00,local_4c0->m_buffers);
  sglr::ContextWrapper::glDisable(this_00,0xc11);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_4b8.m_data[0] = -1.0;
  local_4b8.m_data[1] = -1.0;
  local_4b8.m_data._8_8_ = (ulong)(uint)local_4b8.m_data[3] << 0x20;
  local_4a0.m_data[0] = 1.0;
  local_4a0.m_data[1] = 1.0;
  local_4a0.m_data[2] = 0.0;
  sglr::drawQuad(pCVar4,program,(Vec3 *)&local_4b8,(Vec3 *)&local_4a0);
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&local_4c0->super_FboTestCase,local_4a8,0,0,iVar2,iVar3);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		deUint32			fbo				= 0;
		deUint32			tex				= 0;
		FlatColorShader		flatShader		(glu::TYPE_FLOAT_VEC4);
		Texture2DShader		texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		GradientShader		gradShader		(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments		= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID	= getCurrentContext()->createProgram(&flatShader);
		deUint32			texShaderID		= getCurrentContext()->createProgram(&texShader);
		deUint32			gradShaderID	= getCurrentContext()->createProgram(&gradShader);

		int				invalidateX		= getWidth()	/ 4;
		int				invalidateY		= getHeight()	/ 4;
		int				invalidateW		= getWidth()	/ 2;
		int				invalidateH		= getHeight()	/ 2;


		flatShader.setColor   (*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		texShader.setUniforms (*getCurrentContext(), texShaderID);
		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Create fbo.
		glGenFramebuffers		(1, &fbo);
		glGenTextures			(1, &tex);
		glBindTexture			(GL_TEXTURE_2D, tex);
		glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA8, getWidth(), getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		glTexParameteri			(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
		glBindTexture			(GL_TEXTURE_2D, 0);
		checkFramebufferStatus	(GL_FRAMEBUFFER);

		glBindFramebuffer		(GL_FRAMEBUFFER, 0);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Switch to fbo and render gradient into it.
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);
		glBindFramebuffer	(GL_FRAMEBUFFER, fbo);

		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Restore default fbo.
		glBindFramebuffer	(GL_FRAMEBUFFER, 0);

		// Clear invalidated buffers.
		glClearColor	(0.0f, 1.0f, 0.0f, 1.0f);
		glClearStencil	(1);
		glScissor		(invalidateX, invalidateY, invalidateW, invalidateH);
		glEnable		(GL_SCISSOR_TEST);
		glClear			(m_buffers);
		glDisable		(GL_SCISSOR_TEST);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);
		glBindTexture	(GL_TEXTURE_2D, tex);

		sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}